

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# route.c
# Opt level: O0

int equal_route(route_t *a,route_t *b)

{
  int iVar1;
  bool local_19;
  route_t *b_local;
  route_t *a_local;
  
  iVar1 = strcmp(a->id,b->id);
  local_19 = false;
  if (iVar1 == 0) {
    iVar1 = strcmp(a->agency_id,b->agency_id);
    local_19 = false;
    if (iVar1 == 0) {
      iVar1 = strcmp(a->short_name,b->short_name);
      local_19 = false;
      if (iVar1 == 0) {
        iVar1 = strcmp(a->long_name,b->long_name);
        local_19 = false;
        if (iVar1 == 0) {
          iVar1 = strcmp(a->desc,b->desc);
          local_19 = false;
          if (iVar1 == 0) {
            iVar1 = strcmp(a->url,b->url);
            local_19 = false;
            if (iVar1 == 0) {
              iVar1 = strcmp(a->color,b->color);
              local_19 = false;
              if (iVar1 == 0) {
                iVar1 = strcmp(a->text_color,b->text_color);
                local_19 = false;
                if ((iVar1 == 0) && (local_19 = false, a->type == b->type)) {
                  local_19 = a->sort_order == b->sort_order;
                }
              }
            }
          }
        }
      }
    }
  }
  return (int)local_19;
}

Assistant:

int equal_route(const route_t *a, const route_t *b) {
    return (!strcmp(a->id, b->id) &&
             !strcmp(a->agency_id, b->agency_id) &&
             !strcmp(a->short_name, b->short_name) &&
             !strcmp(a->long_name, b->long_name) &&
             !strcmp(a->desc, b->desc) &&
             !strcmp(a->url, b->url) &&
             !strcmp(a->color, b->color) &&
             !strcmp(a->text_color, b->text_color) &&
             a->type == b->type &&
             a->sort_order == b->sort_order);
}